

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTableGet(SharedValidator *this,Location *loc,Var *table_var)

{
  Result rhs;
  Var local_98;
  Enum local_4c;
  undefined1 local_48 [8];
  TableType table_type;
  Var *table_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  table_type.limits._16_8_ = table_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  TableType::TableType((TableType *)local_48);
  Var::Var(&local_98,table_var);
  local_4c = (Enum)CheckTableIndex(this,&local_98,(TableType *)local_48);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_4c);
  Var::~Var(&local_98);
  rhs = TypeChecker::OnTableGet(&this->typechecker_,(Type)local_48._0_4_);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTableGet(const Location& loc, Var table_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  TableType table_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= typechecker_.OnTableGet(table_type.element);
  return result;
}